

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xts_test.cc
# Opt level: O1

void __thiscall XTSTest_TestVectors_Test::TestBody(XTSTest_TestVectors_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  EVP_CIPHER *cipher;
  long lVar4;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar5;
  char *in_R9;
  size_type __n;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ScopedTrace gtest_trace_231;
  bool in_place;
  ScopedTrace gtest_trace_215;
  AssertionResult gtest_ar_;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  int len;
  vector<unsigned_char,_std::allocator<unsigned_char>_> plaintext;
  uint test_num;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ciphertext;
  vector<unsigned_char,_std::allocator<unsigned_char>_> iv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  AssertionResult gtest_ar;
  ScopedTrace local_1b9;
  undefined1 local_1b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  bool local_1a2;
  ScopedTrace local_1a1;
  undefined1 local_1a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_180;
  Bytes local_168;
  AssertHelper local_158;
  int local_150;
  char local_14a [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  uint local_12c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_128;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  undefined1 local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0 [8];
  long local_38;
  
  local_12c = 0;
  lVar4 = 0;
  do {
    local_12c = local_12c + 1;
    testing::ScopedTrace::ScopedTrace<unsigned_int>
              (&local_1a1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
               ,0xd7,&local_12c);
    cipher = EVP_aes_256_xts();
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uchar *)0x0;
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uchar *)0x0;
    local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d0,*(char **)((long)&kXTSTestCases[0].key_hex + lVar4),
               (allocator<char> *)&local_180);
    bVar1 = DecodeHex(&local_e8,(string *)local_d0);
    local_1a0[0] = (internal)bVar1;
    local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_d0._1_7_,local_d0[0]) != local_c0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_d0._1_7_,local_d0[0]),local_c0[0]._M_allocated_capacity + 1)
      ;
    }
    if (local_1a0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_180);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d0,(internal *)local_1a0,
                 (AssertionResult *)"DecodeHex(&key, test.key_hex)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                 ,0xdc,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)&local_180);
LAB_00126fb9:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_d0._1_7_,local_d0[0]) != local_c0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_d0._1_7_,local_d0[0]),
                        local_c0[0]._M_allocated_capacity + 1);
      }
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_180.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      goto LAB_00127127;
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_198;
      local_c8 = local_198;
LAB_00127122:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,local_c8);
LAB_00127127:
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_128.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_148.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_108.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      testing::ScopedTrace::~ScopedTrace(&local_1a1);
      return;
    }
    if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_198,local_198);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d0,*(char **)((long)&kXTSTestCases[0].iv_hex + lVar4),
               (allocator<char> *)&local_180);
    bVar1 = DecodeHex(&local_108,(string *)local_d0);
    local_1a0[0] = (internal)bVar1;
    local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_d0._1_7_,local_d0[0]) != local_c0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_d0._1_7_,local_d0[0]),local_c0[0]._M_allocated_capacity + 1)
      ;
    }
    if (local_1a0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_180);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d0,(internal *)local_1a0,
                 (AssertionResult *)"DecodeHex(&iv, test.iv_hex)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                 ,0xdd,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)&local_180);
      goto LAB_00126fb9;
    }
    if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_198,local_198);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d0,*(char **)((long)&kXTSTestCases[0].plaintext_hex + lVar4),
               (allocator<char> *)&local_180);
    bVar1 = DecodeHex(&local_148,(string *)local_d0);
    local_1a0[0] = (internal)bVar1;
    local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_d0._1_7_,local_d0[0]) != local_c0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_d0._1_7_,local_d0[0]),local_c0[0]._M_allocated_capacity + 1)
      ;
    }
    if (local_1a0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_180);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d0,(internal *)local_1a0,
                 (AssertionResult *)"DecodeHex(&plaintext, test.plaintext_hex)","false","true",in_R9
                );
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                 ,0xde,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)&local_180);
      goto LAB_00126fb9;
    }
    if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_198,local_198);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d0,*(char **)((long)&kXTSTestCases[0].ciphertext_hex + lVar4),
               (allocator<char> *)&local_180);
    bVar1 = DecodeHex(&local_128,(string *)local_d0);
    local_1a0[0] = (internal)bVar1;
    local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_d0._1_7_,local_d0[0]) != local_c0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_d0._1_7_,local_d0[0]),local_c0[0]._M_allocated_capacity + 1)
      ;
    }
    if (local_1a0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_180);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d0,(internal *)local_1a0,
                 (AssertionResult *)"DecodeHex(&ciphertext, test.ciphertext_hex)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                 ,0xdf,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)&local_180);
      goto LAB_00126fb9;
    }
    if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_198,local_198);
    }
    iVar2 = EVP_CIPHER_key_length(cipher);
    local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_180.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,iVar2);
    local_1a0 = (undefined1  [8])
                (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish +
                -(long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_d0,"EVP_CIPHER_key_length(cipher)","key.size()",(uint *)&local_180,
               (unsigned_long *)local_1a0);
    if (local_d0[0] == '\0') {
      testing::Message::Message((Message *)local_1a0);
      if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_c8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_180,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                 ,0xe1,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)local_1a0);
LAB_001270f3:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
      if (local_1a0 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_1a0 + 8))();
      }
      if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      goto LAB_00127127;
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_c8;
      goto LAB_00127122;
    }
    if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c8,local_c8);
    }
    iVar2 = EVP_CIPHER_iv_length(cipher);
    local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_180.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,iVar2);
    local_1a0 = (undefined1  [8])
                (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish +
                -(long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_d0,"EVP_CIPHER_iv_length(cipher)","iv.size()",(uint *)&local_180,
               (unsigned_long *)local_1a0);
    if (local_d0[0] == '\0') {
      testing::Message::Message((Message *)local_1a0);
      if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_c8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_180,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                 ,0xe2,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)local_1a0);
      goto LAB_001270f3;
    }
    if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c8,local_c8);
    }
    local_1a0 = (undefined1  [8])
                (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish +
                -(long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish +
         -(long)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_d0,"plaintext.size()","ciphertext.size()",
               (unsigned_long *)local_1a0,(unsigned_long *)&local_180);
    if (local_d0[0] == '\0') {
      testing::Message::Message((Message *)local_1a0);
      if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_c8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_180,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                 ,0xe3,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)local_1a0);
      goto LAB_001270f3;
    }
    local_38 = lVar4;
    if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c8,local_c8);
    }
    local_14a[0] = '\0';
    local_14a[1] = '\x01';
    bVar1 = false;
    lVar4 = 0;
    do {
      local_1a2 = (bool)local_14a[lVar4];
      testing::ScopedTrace::ScopedTrace<bool>
                (&local_1b9,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                 ,0xe7,&local_1a2);
      pbVar6 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      __n = (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_180,__n,(allocator_type *)local_d0);
      if (local_1a2 == true) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_180,&local_148)
        ;
        __n = (long)local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        pbVar6 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
      }
      EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)local_d0);
      iVar2 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)local_d0,cipher,(ENGINE *)0x0,
                                 local_e8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 local_108.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
      local_1b8[0] = iVar2 != 0;
      local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_168);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1a0,(internal *)local_1b8,
                   (AssertionResult *)
                   "EVP_EncryptInit_ex(ctx.get(), cipher, nullptr, key.data(), iv.data())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                   ,0xf3,(char *)local_1a0);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        if (local_1a0 != (undefined1  [8])&local_190) {
          operator_delete((void *)local_1a0,local_190._M_allocated_capacity + 1);
        }
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_168.span_.data_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_168.span_.data_ + 8))();
        }
        if (local_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1b0,local_1b0);
        }
        EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)local_d0);
LAB_00126d4e:
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete(local_180.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_180.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_180.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        testing::ScopedTrace::~ScopedTrace(&local_1b9);
        break;
      }
      iVar2 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)local_d0,
                                local_180.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,&local_150,(uchar *)pbVar6,
                                (int)__n);
      local_1b8[0] = iVar2 != 0;
      local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_168);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1a0,(internal *)local_1b8,
                   (AssertionResult *)
                   "EVP_EncryptUpdate(ctx.get(), out.data(), &len, in.data(), in.size())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                   ,0xf6,(char *)local_1a0);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_168);
LAB_00126cfe:
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        if (local_1a0 != (undefined1  [8])&local_190) {
          operator_delete((void *)local_1a0,local_190._M_allocated_capacity + 1);
        }
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_168.span_.data_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_168.span_.data_ + 8))();
        }
        if (local_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1b0,local_1b0);
        }
        EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)local_d0);
        goto LAB_00126d4e;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_180,(long)local_150)
      ;
      local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      local_1b8 = (undefined1  [8])
                  local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_168.span_.size_ =
           (long)local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
      local_168.span_.data_ =
           local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_1a0,"Bytes(ciphertext)","Bytes(out)",(Bytes *)local_1b8,
                 &local_168);
      if (local_1a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_1b8);
        pcVar5 = "";
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_198->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                   ,0xf8,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)local_1b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
        if (local_1b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_1b8 + 8))();
        }
      }
      if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_198,local_198);
      }
      pbVar6 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = (int)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      if (local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_180,
                 (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
      if (local_1a2 == true) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_180,&local_128)
        ;
        iVar2 = (int)local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
        pbVar6 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
      }
      EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)local_d0);
      EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)local_d0);
      iVar3 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)local_d0,cipher,(ENGINE *)0x0,
                                 local_e8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 local_108.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
      local_1b8[0] = iVar3 != 0;
      local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&local_168);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1a0,(internal *)local_1b8,
                   (AssertionResult *)
                   "EVP_DecryptInit_ex(ctx.get(), cipher, nullptr, key.data(), iv.data())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                   ,0x105,(char *)local_1a0);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_168);
        goto LAB_00126cfe;
      }
      iVar2 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)local_d0,
                                local_180.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,&local_150,(uchar *)pbVar6,
                                iVar2 - (int)pbVar6);
      local_1b8[0] = iVar2 != 0;
      local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_168);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1a0,(internal *)local_1b8,
                   (AssertionResult *)
                   "EVP_DecryptUpdate(ctx.get(), out.data(), &len, in.data(), in.size())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                   ,0x107,(char *)local_1a0);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_168);
        goto LAB_00126cfe;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_180,(long)local_150)
      ;
      local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish +
                  -(long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      local_1b8 = (undefined1  [8])
                  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_168.span_.size_ =
           (long)local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
      local_168.span_.data_ =
           local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_1a0,"Bytes(plaintext)","Bytes(out)",(Bytes *)local_1b8,&local_168
                );
      if (local_1a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_1b8);
        pcVar5 = "";
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_198->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                   ,0x109,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)local_1b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
        if (local_1b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_1b8 + 8))();
        }
      }
      if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_198,local_198);
      }
      EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)local_d0);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(local_180.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_180.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_180.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      testing::ScopedTrace::~ScopedTrace(&local_1b9);
      lVar4 = lVar4 + 1;
      bVar1 = lVar4 == 2;
    } while (!bVar1);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_128.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    lVar4 = local_38;
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_148.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_148.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_108.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    testing::ScopedTrace::~ScopedTrace(&local_1a1);
    lVar4 = lVar4 + 0x20;
    if (!(bool)(bVar1 & lVar4 != 0xa0)) {
      return;
    }
  } while( true );
}

Assistant:

TEST(XTSTest, TestVectors) {
  unsigned test_num = 0;
  for (const auto &test : kXTSTestCases) {
    test_num++;
    SCOPED_TRACE(test_num);

    const EVP_CIPHER *cipher = EVP_aes_256_xts();

    std::vector<uint8_t> key, iv, plaintext, ciphertext;
    ASSERT_TRUE(DecodeHex(&key, test.key_hex));
    ASSERT_TRUE(DecodeHex(&iv, test.iv_hex));
    ASSERT_TRUE(DecodeHex(&plaintext, test.plaintext_hex));
    ASSERT_TRUE(DecodeHex(&ciphertext, test.ciphertext_hex));

    ASSERT_EQ(EVP_CIPHER_key_length(cipher), key.size());
    ASSERT_EQ(EVP_CIPHER_iv_length(cipher), iv.size());
    ASSERT_EQ(plaintext.size(), ciphertext.size());

    // Note XTS doesn't support streaming, so we only test single-shot inputs.
    for (bool in_place : {false, true}) {
      SCOPED_TRACE(in_place);

      // Test encryption.
      bssl::Span<const uint8_t> in = plaintext;
      std::vector<uint8_t> out(plaintext.size());
      if (in_place) {
        out = plaintext;
        in = out;
      }

      bssl::ScopedEVP_CIPHER_CTX ctx;
      ASSERT_TRUE(EVP_EncryptInit_ex(ctx.get(), cipher, nullptr, key.data(),
                                     iv.data()));
      int len;
      ASSERT_TRUE(
          EVP_EncryptUpdate(ctx.get(), out.data(), &len, in.data(), in.size()));
      out.resize(len);
      EXPECT_EQ(Bytes(ciphertext), Bytes(out));

      // Test decryption.
      in = ciphertext;
      out.clear();
      out.resize(plaintext.size());
      if (in_place) {
        out = ciphertext;
        in = out;
      }

      ctx.Reset();
      ASSERT_TRUE(EVP_DecryptInit_ex(ctx.get(), cipher, nullptr, key.data(),
                                     iv.data()));
      ASSERT_TRUE(
          EVP_DecryptUpdate(ctx.get(), out.data(), &len, in.data(), in.size()));
      out.resize(len);
      EXPECT_EQ(Bytes(plaintext), Bytes(out));
    }
  }
}